

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

void cleanup_artifact(void)

{
  artifact *paVar1;
  long lVar2;
  ulong uVar3;
  
  if (z_info->a_max != 0) {
    lVar2 = 0x118;
    uVar3 = 0;
    do {
      paVar1 = a_info;
      string_free(*(char **)((long)a_info + lVar2 + -0x118));
      string_free(*(char **)(paVar1->flags + lVar2 + -0x4c));
      string_free(*(char **)(paVar1->flags + lVar2 + -0x3c));
      string_free(*(char **)((long)paVar1 + lVar2 + -0x110));
      mem_free(*(void **)(paVar1->flags + lVar2 + -0x7c));
      mem_free(*(void **)(paVar1->flags + lVar2 + -0x74));
      mem_free(*(void **)(paVar1->flags + lVar2 + -0x6c));
      free_effect(*(effect **)(paVar1->flags + lVar2 + -0x44));
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x140;
    } while (uVar3 < z_info->a_max);
  }
  mem_free(a_info);
  mem_free(aup_info);
  return;
}

Assistant:

static void cleanup_artifact(void)
{
	int idx;
	for (idx = 0; idx < z_info->a_max; idx++) {
		struct artifact *art = &a_info[idx];
		string_free(art->name);
		string_free(art->alt_msg);
		string_free(art->effect_msg);
		string_free(art->text);
		mem_free(art->brands);
		mem_free(art->slays);
		mem_free(art->curses);
		free_effect(art->effect);
	}
	mem_free(a_info);
	mem_free(aup_info);
}